

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

void __thiscall GEO::Delaunay3dThread::run(Delaunay3dThread *this)

{
  bool bVar1;
  index_t iVar2;
  index_t *local_40;
  uint local_38;
  byte local_31;
  bool success;
  index_t *hint;
  index_t v;
  Delaunay3dThread *this_local;
  
  this->finished_ = false;
  if ((this->work_begin_ != -1) && (this->work_end_ != -1)) {
    this->memory_overflow_ = false;
    this->b_hint_ = 0xffffffff;
    this->e_hint_ = 0xffffffff;
    this->direction_ = true;
    while( true ) {
      local_31 = 0;
      if (this->work_begin_ <= this->work_end_) {
        local_31 = this->memory_overflow_ ^ 0xff;
      }
      if ((local_31 & 1) == 0) break;
      if ((this->direction_ & 1U) == 0) {
        local_38 = this->work_end_;
      }
      else {
        local_38 = this->work_begin_;
      }
      if ((this->direction_ & 1U) == 0) {
        local_40 = &this->e_hint_;
      }
      else {
        local_40 = &this->b_hint_;
      }
      bVar1 = insert(this,this->reorder_[local_38],local_40);
      send_event(this);
      if (bVar1) {
        if ((this->direction_ & 1U) == 0) {
          this->work_end_ = this->work_end_ + -1;
        }
        else {
          this->work_begin_ = this->work_begin_ + 1;
        }
      }
      else {
        this->nb_rollbacks_ = this->nb_rollbacks_ + 1;
        if (this->interfering_thread_ != 0xff) {
          this->interfering_thread_ = (thread_index_t)((int)(uint)this->interfering_thread_ >> 1);
          iVar2 = Thread::id(&this->super_Thread);
          if (iVar2 < this->interfering_thread_) {
            wait_for_event(this,(uint)this->interfering_thread_);
          }
          else {
            this->direction_ = (bool)((this->direction_ ^ 0xffU) & 1);
          }
        }
      }
    }
    this->finished_ = true;
    pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
    send_event(this);
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  }
  return;
}

Assistant:

void run() override {
            
            finished_ = false;

            if(work_begin_ == -1 || work_end_ == -1) {
                return ;
            }

            memory_overflow_ = false;

            // Current hint associated with b
            b_hint_ = NO_TETRAHEDRON;

            // Current hint associated with e
            e_hint_ = NO_TETRAHEDRON;

            // If true, insert in b->e order,
            // else insert in e->b order
            direction_ = true;
            
            while(work_end_ >= work_begin_ && !memory_overflow_) {
                index_t v = direction_ ? 
                    index_t(work_begin_) : index_t(work_end_) ;
                index_t& hint = direction_ ? b_hint_ : e_hint_;

                // Try to insert v and update hint
                bool success = insert(reorder_[v],hint);

                //   Notify all threads that are waiting for
                // this thread to release some tetrahedra.
                send_event();

                if(success) {
                    if(direction_) {
                        ++work_begin_;
                    } else {
                        --work_end_;
                    }
                } else {
                    ++nb_rollbacks_;
                    if(interfering_thread_ != NO_THREAD) {
                        interfering_thread_ = thread_index_t(
                            interfering_thread_ >> 1
                        );
                        if(id() < interfering_thread_) {
                            // If this thread has a higher priority than
                            // the one that interfered, wait for the
                            // interfering thread to release the tets that
                            // it holds (then the loop will retry to insert
                            // the same vertex).
                            wait_for_event(interfering_thread_);
                        } else {
                            // If this thread has a lower priority than
                            // the interfering thread, try inserting 
                            // from the other end of the points sequence.
                            direction_ = !direction_;
                        }
                    }
                }
            }
            finished_ = true;

	    //   Fix by Hiep Vu: wake up threads that potentially missed
	    // the previous wake ups.
	    pthread_mutex_lock(&mutex_);
	    send_event();
	    pthread_mutex_unlock(&mutex_);
        }